

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

bool jsoncons::detail::dtoa_general<jsoncons::stream_sink<wchar_t>>
               (stream_sink<wchar_t> *param_1,char param_2,undefined8 param_3)

{
  bool bVar1;
  double u;
  char buffer [100];
  int *in_stack_00000088;
  int k;
  int length;
  char *result;
  double in_stack_000000a0;
  undefined8 local_b0;
  wchar_t in_stack_ffffffffffffff5c;
  stream_sink<wchar_t> *in_stack_ffffffffffffff60;
  stream_sink<wchar_t> *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined1 local_1;
  
  if (((double)param_1 != 0.0) || (NAN((double)param_1))) {
    bVar1 = std::signbit((double)param_1);
    local_b0 = param_1;
    if (bVar1) {
      local_b0 = (stream_sink<wchar_t> *)((ulong)param_1 ^ 0x8000000000000000);
    }
    bVar1 = grisu3(in_stack_000000a0,result,_k,in_stack_00000088);
    if (bVar1) {
      bVar1 = std::signbit((double)param_1);
      if (bVar1) {
        stream_sink<wchar_t>::push_back(local_b0,in_stack_ffffffffffffff5c);
      }
      prettify_string<jsoncons::stream_sink<wchar_t>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
      local_1 = true;
    }
    else {
      local_1 = dtoa_general<jsoncons::stream_sink<wchar_t>>(param_1,(int)param_2,param_3);
    }
  }
  else {
    stream_sink<wchar_t>::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    stream_sink<wchar_t>::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    stream_sink<wchar_t>::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool dtoa_general(double v, char decimal_point, Result& result, std::true_type)
    {
        if (v == 0)
        {
            result.push_back('0');
            result.push_back('.');
            result.push_back('0');
            return true;
        }

        int length = 0;
        int k;

        char buffer[100];

        double u = std::signbit(v) ? -v : v;
        if (jsoncons::detail::grisu3(u, buffer, &length, &k))
        {
            if (std::signbit(v))
            {
                result.push_back('-');
            }
            // min exp: -4 is consistent with sprintf
            // max exp: std::numeric_limits<double>::max_digits10
            jsoncons::detail::prettify_string(buffer, length, k, -4, std::numeric_limits<double>::max_digits10, result);
            return true;
        }
        else
        {
            return dtoa_general(v, decimal_point, result, std::false_type());
        }
    }